

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgtextelement.cpp
# Opt level: O0

void __thiscall lunasvg::SVGTextElement::SVGTextElement(SVGTextElement *this,Document *document)

{
  Document *document_local;
  SVGTextElement *this_local;
  
  SVGTextPositioningElement::SVGTextPositioningElement
            (&this->super_SVGTextPositioningElement,document,Text);
  (this->super_SVGTextPositioningElement).super_SVGGraphicsElement.super_SVGElement.super_SVGNode.
  _vptr_SVGNode = (_func_int **)&PTR__SVGTextElement_001c41d8;
  std::vector<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>::vector
            (&this->m_fragments);
  std::__cxx11::u32string::u32string((u32string *)&this->m_text);
  return;
}

Assistant:

SVGTextElement::SVGTextElement(Document* document)
    : SVGTextPositioningElement(document, ElementID::Text)
{
}